

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O3

void PrintEnterBlock(ExpressionGraphContext *ctx,char *name)

{
  OutputContext *this;
  size_t sVar1;
  
  PrintIndent(ctx);
  this = ctx->output;
  sVar1 = strlen(name);
  OutputContext::Print(this,name,(uint)sVar1);
  OutputContext::Print(ctx->output,"{\n",2);
  ctx->depth = ctx->depth + 1;
  return;
}

Assistant:

void PrintEnterBlock(ExpressionGraphContext &ctx, const char *name)
{
	PrintIndent(ctx);

	ctx.output.Print(name);
	ctx.output.Print("{\n");

	ctx.depth++;
}